

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.cc
# Opt level: O2

void tvm::runtime::SaveBinaryToFile(string *file_name,string *data)

{
  ostream *poVar1;
  LogMessageFatal local_3a0;
  ofstream fs;
  byte abStack_1f8 [480];
  
  std::ofstream::ofstream(&fs,(string *)file_name,_S_out|_S_bin);
  if ((abStack_1f8[*(long *)(_fs + -0x18)] & 5) != 0) {
    dmlc::LogMessageFatal::LogMessageFatal
              (&local_3a0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/file_util.cc"
               ,0x8a);
    poVar1 = std::operator<<((ostream *)&local_3a0,"Check failed: !fs.fail()");
    poVar1 = std::operator<<(poVar1,": ");
    poVar1 = std::operator<<(poVar1,"Cannot open ");
    std::operator<<(poVar1,(string *)file_name);
    dmlc::LogMessageFatal::~LogMessageFatal(&local_3a0);
  }
  std::ostream::write((char *)&fs,(long)(data->_M_dataplus)._M_p);
  std::ofstream::~ofstream(&fs);
  return;
}

Assistant:

void SaveBinaryToFile(
    const std::string &file_name,
    const std::string &data) {
  std::ofstream fs(file_name, std::ios::out | std::ios::binary);
  CHECK(!fs.fail()) << "Cannot open " << file_name;
  fs.write(&data[0], data.length());
}